

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockCallTest_disableEnable_TestShell::createTest
          (TEST_MockCallTest_disableEnable_TestShell *this)

{
  Utest *this_00;
  TEST_MockCallTest_disableEnable_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0x162);
  TEST_MockCallTest_disableEnable_Test::TEST_MockCallTest_disableEnable_Test
            ((TEST_MockCallTest_disableEnable_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, disableEnable)
{
    mock().disable();
    mock().expectOneCall("function");
    mock().actualCall("differenFunction");
    CHECK(! mock().expectedCallsLeft());
    mock().enable();
    mock().expectOneCall("function");
    CHECK(mock().expectedCallsLeft());
    mock().actualCall("function");

    mock().checkExpectations();
}